

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pizza_cutter.cpp
# Opt level: O1

ostream * operator<<(ostream *os,pizza_slice ps)

{
  ostream *poVar1;
  char local_1b [3];
  
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)os,ps.row1);
  local_1b[0] = ' ';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_1b,1);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,ps.col1);
  local_1b[1] = 0x20;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_1b + 1,1);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,ps.row2);
  local_1b[2] = 0x20;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_1b + 2,1);
  std::ostream::operator<<((ostream *)poVar1,ps.col2);
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, pizza_slice ps) noexcept
{
    os << ps.row1 << ' ' << ps.col1 << ' ' << ps.row2 << ' ' << ps.col2;
    return os;
}